

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O1

size_t intersection_uint32(uint32_t *A,size_t lenA,uint32_t *B,size_t lenB,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint32_t *puVar4;
  
  if (lenB == 0 || lenA == 0) {
    return 0;
  }
  puVar1 = A + lenA;
  puVar2 = B + lenB;
  puVar4 = out;
  do {
    while (uVar3 = *A, *B <= uVar3) {
      while (*B < uVar3) {
        B = B + 1;
        if (B == puVar2) goto LAB_001102bf;
      }
      if (uVar3 != *B) break;
      *puVar4 = uVar3;
      puVar4 = puVar4 + 1;
      A = A + 1;
      if ((A == puVar1) || (B = B + 1, B == puVar2)) goto LAB_001102bf;
    }
    A = A + 1;
  } while (A != puVar1);
LAB_001102bf:
  return (long)puVar4 - (long)out >> 2;
}

Assistant:

size_t intersection_uint32(const uint32_t *A, const size_t lenA,
                           const uint32_t *B, const size_t lenB,
                           uint32_t *out) {
    const uint32_t *initout = out;
    if (lenA == 0 || lenB == 0) return 0;
    const uint32_t *endA = A + lenA;
    const uint32_t *endB = B + lenB;

    while (1) {
        while (*A < *B) {
        SKIP_FIRST_COMPARE:
            if (++A == endA) return (out - initout);
        }
        while (*A > *B) {
            if (++B == endB) return (out - initout);
        }
        if (*A == *B) {
            *out++ = *A;
            if (++A == endA || ++B == endB) return (out - initout);
        } else {
            goto SKIP_FIRST_COMPARE;
        }
    }
    // return (out - initout);  // NOTREACHED
}